

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool duckdb::ToCStringCastWrapper<duckdb::CastFromBlob>::Operation<duckdb::string_t,duckdb_string>
               (string_t input,duckdb_string *result)

{
  char *__dest;
  Vector *in_RCX;
  char *__src;
  uint uVar1;
  ulong __n;
  string_t input_00;
  string_t result_string;
  LogicalType local_a8;
  Vector result_vector;
  
  input_00.value._0_8_ = input.value._8_8_;
  LogicalType::LogicalType(&local_a8,VARCHAR);
  Vector::Vector(&result_vector,&local_a8,(data_ptr_t)0x0);
  LogicalType::~LogicalType(&local_a8);
  input_00.value.pointer.ptr = (char *)&result_vector;
  result_string = CastFromBlob::Operation<duckdb::string_t>(input.value._0_8_,input_00,in_RCX);
  __src = result_string.value._8_8_;
  uVar1 = result_string.value._0_4_;
  __n = result_string.value._0_8_ & 0xffffffff;
  __dest = (char *)duckdb_malloc(__n + 1);
  if (uVar1 < 0xd) {
    __src = (char *)((long)&result_string.value + 4);
  }
  switchD_016b0717::default(__dest,__src,__n);
  __dest[__n] = '\0';
  result->data = __dest;
  result->size = __n;
  Vector::~Vector(&result_vector);
  return true;
}

Assistant:

static bool Operation(SOURCE_TYPE input, RESULT_TYPE &result) {
		Vector result_vector(LogicalType::VARCHAR, nullptr);
		auto result_string = OP::template Operation<SOURCE_TYPE>(input, result_vector);
		auto result_size = result_string.GetSize();
		auto result_data = result_string.GetData();

		char *allocated_data = char_ptr_cast(duckdb_malloc(result_size + 1));
		memcpy(allocated_data, result_data, result_size);
		allocated_data[result_size] = '\0';
		result.data = allocated_data;
		result.size = result_size;
		return true;
	}